

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::recordBufferQueryPreciseWithFlagTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::Handle<(vk::HandleType)11>_> data_02;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk_00;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *this;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)11> *pHVar6;
  allocator<char> local_2f1;
  string local_2f0;
  deUint64 local_2d0;
  deUint64 local_2c8;
  deUint64 local_2c0;
  Move<vk::Handle<(vk::HandleType)11>_> local_2b8;
  RefData<vk::Handle<(vk::HandleType)11>_> local_298;
  undefined1 local_278 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> queryPool;
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  undefined4 local_230 [2];
  VkCommandBufferBeginInfo secBufferBeginInfo;
  VkCommandBufferInheritanceInfo secBufferInheritInfo;
  VkCommandBufferBeginInfo primBufferBeginInfo;
  RefData<vk::VkCommandBuffer_s_*> local_198;
  undefined1 local_178 [8];
  Unique<vk::VkCommandBuffer_s_*> secCmdBuf;
  VkCommandBufferAllocateInfo secCmdBufParams;
  RefData<vk::VkCommandBuffer_s_*> local_118;
  undefined1 local_f8 [8];
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferAllocateInfo primCmdBufParams;
  RefData<vk::Handle<(vk::HandleType)24>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  Context::getUniversalQueueFamilyIndex(context);
  pVVar3 = Context::getDeviceFeatures(context);
  if (pVVar3->inheritedQueries == 0) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Inherited queries feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
               ,0xad7);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&primCmdBufParams.level,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&primCmdBufParams.level);
  data.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&primCmdBufParams.level);
  primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  primCmdBufParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  primCmdBufParams._4_4_ = 0;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_78);
  primCmdBufParams.pNext = (void *)pHVar4->m_internal;
  primCmdBufParams.commandPool.m_internal._0_4_ = 0;
  primCmdBufParams.commandPool.m_internal._4_4_ = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&secCmdBufParams.level,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&secCmdBufParams.level);
  data_00.deleter.m_deviceIface = local_118.deleter.m_deviceIface;
  data_00.object = local_118.object;
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_118.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_f8,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&secCmdBufParams.level);
  secCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  secCmdBufParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  secCmdBufParams._4_4_ = 0;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_78);
  secCmdBufParams.pNext = (void *)pHVar4->m_internal;
  secCmdBufParams.commandPool.m_internal._0_4_ = 1;
  secCmdBufParams.commandPool.m_internal._4_4_ = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primBufferBeginInfo.pInheritanceInfo,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &secCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_198,(Move *)&primBufferBeginInfo.pInheritanceInfo);
  data_01.deleter.m_deviceIface = local_198.deleter.m_deviceIface;
  data_01.object = local_198.object;
  data_01.deleter.m_device = local_198.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_198.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_178,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&primBufferBeginInfo.pInheritanceInfo);
  primBufferBeginInfo.pNext = (void *)0x0;
  primBufferBeginInfo.flags = 0;
  primBufferBeginInfo._20_4_ = 0;
  secBufferInheritInfo.pipelineStatistics = 0x2a;
  secBufferInheritInfo._52_4_ = 0;
  primBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  primBufferBeginInfo._4_4_ = 0;
  secBufferBeginInfo.pInheritanceInfo._0_4_ = 0x29;
  secBufferInheritInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  secBufferInheritInfo._4_4_ = 0;
  ::vk::Handle<(vk::HandleType)17>::Handle
            ((Handle<(vk::HandleType)17> *)&secBufferInheritInfo.pNext,0);
  secBufferInheritInfo.renderPass.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)23>::Handle
            ((Handle<(vk::HandleType)23> *)&secBufferInheritInfo.subpass,0);
  secBufferInheritInfo.framebuffer.m_internal._0_4_ = 1;
  secBufferInheritInfo.framebuffer.m_internal._4_4_ = 1;
  secBufferInheritInfo.occlusionQueryEnable = 0;
  local_230[0] = 0x2a;
  secBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  secBufferBeginInfo._4_4_ = 0;
  secBufferBeginInfo.pNext._0_4_ = 0;
  secBufferBeginInfo._16_8_ = &secBufferBeginInfo.pInheritanceInfo;
  queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0xb;
  ::vk::createQueryPool
            (&local_2b8,vk_00,device,
             (VkQueryPoolCreateInfo *)
             &queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_298,(Move *)&local_2b8);
  data_02.deleter.m_deviceIface = local_298.deleter.m_deviceIface;
  data_02.object.m_internal = local_298.object.m_internal;
  data_02.deleter.m_device = local_298.deleter.m_device;
  data_02.deleter.m_allocator = local_298.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_278,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_2b8);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_178);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar5,local_230);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xb1e);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_178);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(secCmdBuf.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xb1f);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])
                    (vk_00,*ppVVar5,&secBufferInheritInfo.pipelineStatistics);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xb21);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_278);
  local_2c0 = pHVar6->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,pVVar1,local_2c0,0,1);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_278);
  local_2c8 = pHVar6->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6e])(vk_00,pVVar1,local_2c8,0,1);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  pVVar1 = *ppVVar5;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_178);
  (*vk_00->_vptr_DeviceInterface[0x77])(vk_00,pVVar1,1,ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_278);
  local_2d0 = pHVar6->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,pVVar1,local_2d0,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(primCmdBuf.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xb2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,
             "Successfully recorded a secondary command buffer allowing a precise occlusion query.",
             &local_2f1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_278);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_178);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus recordBufferQueryPreciseWithFlagTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	if (!context.getDeviceFeatures().inheritedQueries)
		TCU_THROW(NotSupportedError, "Inherited queries feature is not supported");

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		primCmdBufParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &primCmdBufParams));

	// Secondary Command buffer params
	const VkCommandBufferAllocateInfo		secCmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_SECONDARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			secCmdBuf				(allocateCommandBuffer(vk, vkDevice, &secCmdBufParams));

	const VkCommandBufferBeginInfo			primBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const VkCommandBufferInheritanceInfo	secBufferInheritInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		0u,															// renderPass
		0u,															// subpass
		0u,															// framebuffer
		VK_TRUE,													// occlusionQueryEnable
		VK_QUERY_CONTROL_PRECISE_BIT,								// queryFlags
		(VkQueryPipelineStatisticFlags)0u,							// pipelineStatistics
	};
	const VkCommandBufferBeginInfo			secBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		&secBufferInheritInfo,
	};

	const VkQueryPoolCreateInfo				queryPoolCreateInfo		=
	{
		VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		(VkQueryPoolCreateFlags)0,									// flags
		VK_QUERY_TYPE_OCCLUSION,									// queryType
		1u,															// entryCount
		0u,															// pipelineStatistics
	};
	Unique<VkQueryPool>						queryPool				(createQueryPool(vk, vkDevice, &queryPoolCreateInfo));

	VK_CHECK(vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo));
	VK_CHECK(vk.endCommandBuffer(secCmdBuf.get()));

	VK_CHECK(vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo));
	{
		vk.cmdResetQueryPool(primCmdBuf.get(), queryPool.get(), 0u, 1u);
		vk.cmdBeginQuery(primCmdBuf.get(), queryPool.get(), 0u, VK_QUERY_CONTROL_PRECISE_BIT);
		{
			vk.cmdExecuteCommands(primCmdBuf.get(), 1u, &secCmdBuf.get());
		}
		vk.cmdEndQuery(primCmdBuf.get(), queryPool.get(), 0u);
	}
	VK_CHECK(vk.endCommandBuffer(primCmdBuf.get()));

	return tcu::TestStatus::pass("Successfully recorded a secondary command buffer allowing a precise occlusion query.");
}